

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O1

void dlep_router_terminate_all_sessions(void)

{
  avl_tree *paVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  paVar1 = dlep_if_get_tree(false);
  plVar2 = (paVar1->list_head).next;
  plVar3 = plVar2->prev;
  paVar1 = dlep_if_get_tree(false);
  if (plVar3 != (paVar1->list_head).prev) {
    do {
      for (plVar3 = plVar2[3].prev; plVar3->prev != plVar2[4].next; plVar3 = plVar3->next) {
        dlep_session_terminate
                  ((dlep_session *)&plVar3[-0x38].prev,DLEP_STATUS_OKAY,
                   "DLEP router is shutting down");
      }
      plVar2 = plVar2->next;
      plVar3 = plVar2->prev;
      paVar1 = dlep_if_get_tree(false);
    } while (plVar3 != (paVar1->list_head).prev);
  }
  return;
}

Assistant:

void
dlep_router_terminate_all_sessions(void) {
  struct dlep_router_if *interf;
  struct dlep_router_session *router_session;

  _shutting_down = true;

  avl_for_each_element(dlep_if_get_tree(false), interf, interf._node) {
    avl_for_each_element(&interf->interf.session_tree, router_session, _node) {
      dlep_session_terminate(&router_session->session, DLEP_STATUS_OKAY, "DLEP router is shutting down");
    }
  }
}